

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void tinygltf::SerializeGltfTextureInfo(TextureInfo *texinfo,json *o)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"index",&local_31);
  SerializeNumberProperty<int>(&local_30,texinfo->index,o);
  std::__cxx11::string::~string((string *)&local_30);
  if (texinfo->texCoord != 0) {
    std::__cxx11::string::string((string *)&local_30,"texCoord",&local_31);
    SerializeNumberProperty<int>(&local_30,texinfo->texCoord,o);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((char)(texinfo->extras).type_ != '\0') {
    std::__cxx11::string::string((string *)&local_30,"extras",&local_31);
    SerializeValue(&local_30,&texinfo->extras,o);
    std::__cxx11::string::~string((string *)&local_30);
  }
  SerializeExtensionMap(&texinfo->extensions,o);
  return;
}

Assistant:

static void SerializeGltfTextureInfo(TextureInfo &texinfo, json &o) {
  SerializeNumberProperty("index", texinfo.index, o);

  if (texinfo.texCoord != 0) {
    SerializeNumberProperty("texCoord", texinfo.texCoord, o);
  }

  if (texinfo.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", texinfo.extras, o);
  }

  SerializeExtensionMap(texinfo.extensions, o);
}